

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lnsrchmp.c
# Opt level: O3

int lnsrchmt(custom_function *funcpt,custom_gradient *funcgrad,double *xi,double *f,double *jac,
            double *alpha,double *p,int N,double *dx,double maxstep,int MAXITER,double eps2,
            double ftol,double gtol,double xtol,double *x)

{
  int iVar1;
  ulong uVar2;
  
  if (0 < N) {
    uVar2 = 0;
    do {
      x[uVar2] = xi[uVar2];
      uVar2 = uVar2 + 1;
    } while ((uint)N != uVar2);
  }
  iVar1 = cvsrch(funcpt,funcgrad,x,f,jac,alpha,p,N,dx,maxstep,MAXITER,eps2,ftol,gtol,xtol);
  return iVar1;
}

Assistant:

int lnsrchmt(custom_function *funcpt, custom_gradient *funcgrad, double *xi, double *f, double *jac, double *alpha, double *p, int N, double *dx, double maxstep, int MAXITER,
		double eps2,double ftol, double gtol, double xtol, double *x) {
	int i,retval,info;

	/*
	* Return Codes
	*
	* Codes 1,2,3 denote possible success.
	* Codes 0 and 4 denote failure.
	*
	* 1 - df(x)/dx <= gtol achieved so xf may be the local minima.
	* 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so xf may be the local minima.
	* 3 - Global Step failed to locate a lower point than xi so xi may be the local minima.
	* 4 - Iteration Limit exceeded. Convergence not achieved.
	*
	*/

	//f = funcpt(xi, N);

	// Important - All argument values are modified in this algorithm 

	for (i = 0; i < N; ++i) {
		x[i] = xi[i];
	}

	info = cvsrch(funcpt,funcgrad, x,f, jac, alpha, p, N, dx, maxstep,MAXITER,eps2,
		ftol, gtol, xtol);
	
	retval = info;
	return retval;

}